

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

void anon_unknown.dwarf_47b0::PrintVP8Info(uint8_t *data,int size,FILE *o)

{
  uint3 uVar1;
  uint uVar2;
  int partition_length;
  int version;
  int altref_frame;
  int key;
  uint32_t bits;
  FILE *o_local;
  int size_local;
  uint8_t *data_local;
  
  if (2 < size) {
    uVar1 = *(uint3 *)data;
    uVar2 = (uint)(((uVar1 & 1) != 0 ^ 0xffU) & 1);
    if ((uVar2 == 0) ||
       ((((5 < size && (data[3] == 0x9d)) && (data[4] == '\x01')) && (data[5] == '*')))) {
      fprintf((FILE *)o," key:%d v:%d altref:%d partition_length:%d",(ulong)uVar2,
              (ulong)((uVar1 & 0xe) >> 1),(ulong)(((uVar1 & 0x10) != 0 ^ 0xffU) & 1),
              (ulong)(uVar1 >> 5));
    }
    else {
      fprintf((FILE *)o," invalid VP8 signature");
    }
  }
  return;
}

Assistant:

void PrintVP8Info(const uint8_t* data, int size, FILE* o) {
  if (size < 3)
    return;

  const uint32_t bits = data[0] | (data[1] << 8) | (data[2] << 16);
  const int key = !(bits & 0x1);
  const int altref_frame = !((bits >> 4) & 0x1);
  const int version = (bits >> 1) & 0x7;
  const int partition_length = (bits >> 5) & 0x7FFFF;
  if (key &&
      !(size >= 6 && data[3] == 0x9d && data[4] == 0x01 && data[5] == 0x2a)) {
    fprintf(o, " invalid VP8 signature");
    return;
  }
  fprintf(o, " key:%d v:%d altref:%d partition_length:%d", key, version,
          altref_frame, partition_length);
}